

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::XFBOutputOverlappingTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBOutputOverlappingTest *this,GLuint test_case_index,
          STAGES stage)

{
  STAGES SVar1;
  pointer ptVar2;
  size_t sVar3;
  GLchar *text;
  TestError *pTVar4;
  char *pcVar5;
  bool *text_00;
  bool *text_01;
  size_t position;
  GLchar buffer_goten [16];
  GLchar buffer_gohan [16];
  size_t local_60;
  char local_58 [16];
  char local_48 [24];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBOutputOverlappingTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBOutputOverlappingTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  SVar1 = ptVar2[test_case_index].m_stage;
  if (SVar1 != stage) {
    switch(SVar1) {
    case VERTEX:
      pcVar5 = "";
      if (stage == FRAGMENT) {
        pcVar5 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 gs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = gs_fs;\n}\n\n"
        ;
      }
      goto LAB_008abe93;
    case TESS_CTRL:
      if (stage == FRAGMENT) {
LAB_008abe8c:
        pcVar5 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 gs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = gs_fs;\n}\n\n"
        ;
        goto LAB_008abe93;
      }
      if (stage == VERTEX) goto LAB_008abc8a;
      break;
    case TESS_EVAL:
      if (stage - VERTEX < 5) {
        pcVar5 = (&PTR_anon_var_dwarf_19259a_020d23c8)[stage - VERTEX];
        goto LAB_008abe93;
      }
      break;
    case GEOMETRY:
      if (stage == VERTEX) {
LAB_008abc8a:
        pcVar5 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 in_vs;\nout vec4 vs_tcs;\n\nvoid main()\n{\n    vs_tcs = in_vs;\n}\n\n"
        ;
        goto LAB_008abe93;
      }
      if (stage == FRAGMENT) goto LAB_008abe8c;
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x62ee);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar5 = "";
LAB_008abe93:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar5);
    return __return_storage_ptr__;
  }
  ptVar2 = ptVar2 + test_case_index;
  local_60 = 0;
  text = Utils::Type::GetGLSLTypeName(&ptVar2->m_type);
  sprintf(local_48,"%d",(ulong)ptVar2->m_offset_gohan);
  sprintf(local_58,"%d",(ulong)ptVar2->m_offset_goten);
  switch(stage) {
  case VERTEX:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a17f3c);
    text_00 = ::glcts::fixed_sample_locations_values + 1;
    text_01 = ::glcts::fixed_sample_locations_values + 1;
    goto LAB_008abd01;
  case TESS_CTRL:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a1415c);
    text_01 = (bool *)0x1a832bc;
    goto LAB_008abcfa;
  case TESS_EVAL:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(isolines, point_mode) in;\n\nVAR_DEFINITION\nin  vec4 tcs_tes[];\nout vec4 tes_gs;\n\nvoid main()\n{\n    vec4 result = tcs_tes[0];\n\nVARIABLE_USE\n    tes_gs += result;\n}\n\n"
    ;
    break;
  case GEOMETRY:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nVAR_DEFINITION\nin  vec4 tes_gs[];\nout vec4 gs_fs;\n\nvoid main()\n{\n    vec4 result = tes_gs[0];\n\nVARIABLE_USE\n    gs_fs = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x629e);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar5);
  text_01 = (bool *)0x1a217ec;
LAB_008abcfa:
  text_00 = (bool *)0x1a8326c;
LAB_008abd01:
  Utils::replaceToken("VAR_DEFINITION",&local_60,
                      "layout (xfb_offset = OFFSET) out TYPE gohanARRAY;\nlayout (xfb_offset = OFFSET) out TYPE gotenARRAY;\n"
                      ,__return_storage_ptr__);
  local_60 = 0;
  Utils::replaceToken("OFFSET",&local_60,local_48,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  Utils::replaceToken("ARRAY",&local_60,text_00,__return_storage_ptr__);
  Utils::replaceToken("OFFSET",&local_60,local_58,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  Utils::replaceToken("ARRAY",&local_60,text_00,__return_storage_ptr__);
  sVar3 = local_60;
  Utils::replaceToken("VARIABLE_USE",&local_60,
                      "    gohanINDEX = TYPE(0);\n    gotenINDEX = TYPE(1);\n    if (vec4(0) == result)\n    {\n        gohanINDEX = TYPE(1);\n        gotenINDEX = TYPE(0);\n    }\n"
                      ,__return_storage_ptr__);
  local_60 = sVar3;
  Utils::replaceToken("INDEX",&local_60,text_01,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  Utils::replaceToken("INDEX",&local_60,text_01,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  Utils::replaceToken("INDEX",&local_60,text_01,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  Utils::replaceToken("INDEX",&local_60,text_01,__return_storage_ptr__);
  Utils::replaceToken("TYPE",&local_60,text,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBOutputOverlappingTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* var_definition = "layout (xfb_offset = OFFSET) out TYPE gohanARRAY;\n"
										  "layout (xfb_offset = OFFSET) out TYPE gotenARRAY;\n";
	static const GLchar* var_use = "    gohanINDEX = TYPE(0);\n"
								   "    gotenINDEX = TYPE(1);\n"
								   "    if (vec4(0) == result)\n"
								   "    {\n"
								   "        gohanINDEX = TYPE(1);\n"
								   "        gotenINDEX = TYPE(0);\n"
								   "    }\n";
	static const GLchar* fs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs = result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar* array = "";
		GLchar		  buffer_gohan[16];
		GLchar		  buffer_goten[16];
		const GLchar* index			 = "";
		size_t		  position		 = 0;
		size_t		  position_start = 0;
		const GLchar* type_name		 = test_case.m_type.GetGLSLTypeName();

		sprintf(buffer_gohan, "%d", test_case.m_offset_gohan);
		sprintf(buffer_goten, "%d", test_case.m_offset_goten);

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = 0;
		Utils::replaceToken("OFFSET", position, buffer_gohan, source);
		Utils::replaceToken("TYPE", position, type_name, source);
		Utils::replaceToken("ARRAY", position, array, source);
		Utils::replaceToken("OFFSET", position, buffer_goten, source);
		Utils::replaceToken("TYPE", position, type_name, source);
		Utils::replaceToken("ARRAY", position, array, source);
		position_start = position;
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);
		position = position_start;
		Utils::replaceToken("INDEX", position, index, source);
		Utils::replaceToken("TYPE", position, type_name, source);
		Utils::replaceToken("INDEX", position, index, source);
		Utils::replaceToken("TYPE", position, type_name, source);
		Utils::replaceToken("INDEX", position, index, source);
		Utils::replaceToken("TYPE", position, type_name, source);
		Utils::replaceToken("INDEX", position, index, source);
		Utils::replaceToken("TYPE", position, type_name, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}